

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_vepu2_v2.c
# Opt level: O0

MPP_RET hal_vp8e_vepu2_start_v2(void *hal,HalEncTask *task)

{
  int iVar1;
  long lVar2;
  undefined8 uStack_58;
  RK_U32 reg_size;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  RK_U32 *tmp;
  RK_U32 i;
  HalVp8eCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  if ((vp8e_hal_debug & 4) != 0) {
    tmp._4_4_ = 0;
    lVar2 = *(long *)((long)hal + 0x58);
    for (; tmp._4_4_ < *(uint *)((long)hal + 0x68); tmp._4_4_ = tmp._4_4_ + 1) {
      _mpp_log_l(4,"hal_vp8e_vepu2_v2","reg[%d]:%x\n",(char *)0x0,(ulong)tmp._4_4_,
                 (ulong)*(uint *)(lVar2 + (ulong)tmp._4_4_ * 4));
    }
  }
  iVar1 = *(int *)((long)hal + 0x68);
  rd_cfg._8_8_ = *(undefined8 *)((long)hal + 0x58);
  ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    uStack_58 = *(undefined8 *)((long)hal + 0x58);
    rd_cfg.reg._4_4_ = 0;
    rd_cfg.reg._0_4_ = iVar1 << 2;
    ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),5,&stack0xffffffffffffffa8);
    if (ctx._4_4_ == MPP_OK) {
      ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x50),0xf,(void *)0x0);
      if (ctx._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_vp8e_vepu2_v2","send cmd failed %d\n","hal_vp8e_vepu2_start_v2",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_vp8e_vepu2_v2","set register read failed %d\n","hal_vp8e_vepu2_start_v2",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_vp8e_vepu2_v2","set register write failed %d\n","hal_vp8e_vepu2_start_v2",
               (ulong)(uint)ctx._4_4_);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_vp8e_vepu2_start_v2(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    if (VP8E_DBG_HAL_DUMP_REG & vp8e_hal_debug) {
        RK_U32 i = 0;
        RK_U32 *tmp = (RK_U32 *)ctx->regs;

        for (; i < ctx->reg_size; i++)
            mpp_log("reg[%d]:%x\n", i, tmp[i]);
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size * sizeof(RK_U32);

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}